

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int NV12Copy(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,uint8_t *dst_y,
            int dst_stride_y,uint8_t *dst_uv,int dst_stride_uv,int width,int height)

{
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  long in_R8;
  long in_stack_00000008;
  int halfheight;
  int halfwidth;
  int in_stack_00000020;
  int height_00;
  int in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((((in_RDI == (uint8_t *)0x0) || (in_R8 == 0)) || (in_RDX == (uint8_t *)0x0)) ||
     (((in_stack_00000008 == 0 || ((int)dst_y < 1)) || (in_stack_00000020 == 0)))) {
    local_4 = -1;
  }
  else {
    if (in_stack_00000020 < 0) {
      in_stack_00000020 = -in_stack_00000020;
      in_RDI = in_RDI + (in_stack_00000020 + -1) * in_ESI;
      in_RDX = in_RDX + ((in_stack_00000020 + 1 >> 1) + -1) * in_ECX;
      in_ESI = -in_ESI;
      in_ECX = -in_ECX;
    }
    height_00 = (int)((ulong)in_R8 >> 0x20);
    CopyPlane(in_RDI,in_ESI,in_RDX,in_ECX,in_stack_ffffffffffffffd8,height_00);
    CopyPlane(in_RDI,in_ESI,in_RDX,in_ECX,in_stack_ffffffffffffffd8,height_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int NV12Copy(const uint8_t* src_y, int src_stride_y, const uint8_t* src_uv,
             int src_stride_uv, uint8_t* dst_y, int dst_stride_y,
             uint8_t* dst_uv, int dst_stride_uv, int width, int height) {
  if (!src_y || !dst_y || !src_uv || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }

  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    src_y = src_y + (height - 1) * src_stride_y;
    src_uv = src_uv + (halfheight - 1) * src_stride_uv;
    src_stride_y = -src_stride_y;
    src_stride_uv = -src_stride_uv;
  }
  CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  CopyPlane(src_uv, src_stride_uv, dst_uv, dst_stride_uv, halfwidth * 2,
            halfheight);
  return 0;
}